

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O1

void __thiscall despot::VNode::Free(VNode *this,DSPOMDP *model)

{
  QNode *pQVar1;
  pointer ppSVar2;
  pointer ppQVar3;
  _Rb_tree_node_base *p_Var4;
  _Self __tmp;
  ulong uVar5;
  
  ppSVar2 = (this->particles_).super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->particles_).super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppSVar2) {
    uVar5 = 0;
    do {
      (*model->_vptr_DSPOMDP[0x17])(model,ppSVar2[uVar5]);
      uVar5 = uVar5 + 1;
      ppSVar2 = (this->particles_).
                super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar5 < (ulong)((long)(this->particles_).
                                   super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar2 >> 3))
    ;
  }
  ppQVar3 = (this->children_).super__Vector_base<despot::QNode_*,_std::allocator<despot::QNode_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->children_).super__Vector_base<despot::QNode_*,_std::allocator<despot::QNode_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppQVar3) {
    uVar5 = 0;
    do {
      pQVar1 = ppQVar3[uVar5];
      for (p_Var4 = (pQVar1->children_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var4 != &(pQVar1->children_)._M_t._M_impl.super__Rb_tree_header;
          p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
        Free((VNode *)p_Var4[1]._M_parent,model);
      }
      uVar5 = uVar5 + 1;
      ppQVar3 = (this->children_).
                super__Vector_base<despot::QNode_*,_std::allocator<despot::QNode_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar5 < (ulong)((long)(this->children_).
                                   super__Vector_base<despot::QNode_*,_std::allocator<despot::QNode_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppQVar3 >> 3))
    ;
  }
  return;
}

Assistant:

void VNode::Free(const DSPOMDP& model) {
	for (int i = 0; i < particles_.size(); i++) {
		model.Free(particles_[i]);
	}

	for (int a = 0; a < children().size(); a++) {
		QNode* qnode = Child(a);
		map<OBS_TYPE, VNode*>& children = qnode->children();
		for (map<OBS_TYPE, VNode*>::iterator it = children.begin();
			it != children.end(); it++) {
			it->second->Free(model);
		}
	}
}